

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

char * __thiscall IrSim::print2(IrSim *this,C_IC *i)

{
  char *__format;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int *in_RSI;
  long in_RDI;
  undefined8 in_stack_fffffffffffffec8;
  int iVar4;
  InterCode *in_stack_fffffffffffffed0;
  InterCode *this_00;
  Operand *in_stack_fffffffffffffed8;
  Operand *this_01;
  C_IC *in_stack_ffffffffffffff08;
  size_t sVar5;
  IrSim *in_stack_ffffffffffffff10;
  char *__s;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [48];
  char *local_8;
  
  if (in_RSI[0xe] == 0) {
    local_8 = print1(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    if (*in_RSI == 2) {
      sVar5 = *(size_t *)(in_RDI + 0x60);
      __s = *(char **)(in_RDI + 0x68);
      __format = icFmt[*in_RSI];
      iVar4 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      InterCode::operator[](in_stack_fffffffffffffed0,iVar4);
      Operand::str_abi_cxx11_(in_stack_fffffffffffffed8);
      uVar1 = std::__cxx11::string::c_str();
      Operand::str_abi_cxx11_(in_stack_fffffffffffffed8);
      uVar2 = std::__cxx11::string::c_str();
      InterCode::operator[](in_stack_fffffffffffffed0,iVar4);
      Operand::str_abi_cxx11_(in_stack_fffffffffffffed8);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(__s,sVar5,__format,uVar1,uVar2,uVar3);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
    }
    else {
      sVar5 = *(size_t *)(in_RDI + 0x60);
      this_00 = *(InterCode **)(in_RDI + 0x68);
      this_01 = (Operand *)icFmt[*in_RSI];
      iVar4 = (int)(sVar5 >> 0x20);
      InterCode::operator[](this_00,iVar4);
      Operand::str_abi_cxx11_(this_01);
      uVar1 = std::__cxx11::string::c_str();
      InterCode::operator[](this_00,iVar4);
      Operand::str_abi_cxx11_(this_01);
      uVar2 = std::__cxx11::string::c_str();
      snprintf((char *)this_00,sVar5,(char *)this_01,uVar1,uVar2);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_a8);
    }
    local_8 = *(char **)(in_RDI + 0x68);
  }
  return local_8;
}

Assistant:

const char *IrSim::print2(C_IC &i) const {
    if (i.arg1.kind == IR_NONE) return print1(i);
    if (i.kind == IC_SUB)
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), OP_ZERO.str().c_str(), i[1].str().c_str());
    else
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), i[1].str().c_str());
    return pb;
}